

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

void google::protobuf::internal::WireFormat::SerializeUnknownFields
               (UnknownFieldSet *unknown_fields,CodedOutputStream *output)

{
  int iVar1;
  Type TVar2;
  uint32 uVar3;
  UnknownField *this;
  uint64 uVar4;
  string *str;
  UnknownFieldSet *unknown_fields_00;
  UnknownField *field;
  int i;
  CodedOutputStream *output_local;
  UnknownFieldSet *unknown_fields_local;
  
  for (field._4_4_ = 0; iVar1 = UnknownFieldSet::field_count(unknown_fields), field._4_4_ < iVar1;
      field._4_4_ = field._4_4_ + 1) {
    this = UnknownFieldSet::field(unknown_fields,field._4_4_);
    TVar2 = UnknownField::type(this);
    switch(TVar2) {
    case TYPE_VARINT:
      iVar1 = UnknownField::number(this);
      uVar3 = WireFormatLite::MakeTag(iVar1,WIRETYPE_VARINT);
      io::CodedOutputStream::WriteVarint32(output,uVar3);
      uVar4 = UnknownField::varint(this);
      io::CodedOutputStream::WriteVarint64(output,uVar4);
      break;
    case TYPE_FIXED32:
      iVar1 = UnknownField::number(this);
      uVar3 = WireFormatLite::MakeTag(iVar1,WIRETYPE_FIXED32);
      io::CodedOutputStream::WriteVarint32(output,uVar3);
      uVar3 = UnknownField::fixed32(this);
      io::CodedOutputStream::WriteLittleEndian32(output,uVar3);
      break;
    case TYPE_FIXED64:
      iVar1 = UnknownField::number(this);
      uVar3 = WireFormatLite::MakeTag(iVar1,WIRETYPE_FIXED64);
      io::CodedOutputStream::WriteVarint32(output,uVar3);
      uVar4 = UnknownField::fixed64(this);
      io::CodedOutputStream::WriteLittleEndian64(output,uVar4);
      break;
    case TYPE_LENGTH_DELIMITED:
      iVar1 = UnknownField::number(this);
      uVar3 = WireFormatLite::MakeTag(iVar1,WIRETYPE_LENGTH_DELIMITED);
      io::CodedOutputStream::WriteVarint32(output,uVar3);
      UnknownField::length_delimited_abi_cxx11_(this);
      uVar3 = std::__cxx11::string::size();
      io::CodedOutputStream::WriteVarint32(output,uVar3);
      str = UnknownField::length_delimited_abi_cxx11_(this);
      io::CodedOutputStream::WriteString(output,str);
      break;
    case TYPE_GROUP:
      iVar1 = UnknownField::number(this);
      uVar3 = WireFormatLite::MakeTag(iVar1,WIRETYPE_START_GROUP);
      io::CodedOutputStream::WriteVarint32(output,uVar3);
      unknown_fields_00 = UnknownField::group(this);
      SerializeUnknownFields(unknown_fields_00,output);
      iVar1 = UnknownField::number(this);
      uVar3 = WireFormatLite::MakeTag(iVar1,WIRETYPE_END_GROUP);
      io::CodedOutputStream::WriteVarint32(output,uVar3);
    }
  }
  return;
}

Assistant:

void WireFormat::SerializeUnknownFields(const UnknownFieldSet& unknown_fields,
                                        io::CodedOutputStream* output) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);
    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_VARINT));
        output->WriteVarint64(field.varint());
        break;
      case UnknownField::TYPE_FIXED32:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_FIXED32));
        output->WriteLittleEndian32(field.fixed32());
        break;
      case UnknownField::TYPE_FIXED64:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_FIXED64));
        output->WriteLittleEndian64(field.fixed64());
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
        output->WriteVarint32(field.length_delimited().size());
        output->WriteString(field.length_delimited());
        break;
      case UnknownField::TYPE_GROUP:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_START_GROUP));
        SerializeUnknownFields(field.group(), output);
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_END_GROUP));
        break;
    }
  }
}